

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::ActualConfigure(cmake *this)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  pointer pcVar4;
  string *psVar5;
  pointer pcVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer pcVar9;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *this_00;
  pointer this_01;
  pointer messenger;
  byte local_d5a;
  allocator<char> local_a11;
  string local_a10;
  byte local_9eb;
  byte local_9ea;
  allocator<char> local_9e9;
  string local_9e8;
  cmValue local_9c8;
  allocator<char> local_9b9;
  string local_9b8;
  const_reference local_998;
  value_type *mf;
  string local_988;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  allocator<char> local_911;
  string local_910;
  cmValue local_8f0;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  cmValue local_848;
  allocator<char> local_839;
  string local_838;
  cmValue local_818;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_810;
  string_view local_7f8;
  string local_7e8;
  undefined1 local_7c8 [31];
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  undefined1 local_780 [8];
  string message_5;
  string local_758;
  undefined1 local_738 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  emulator;
  string local_708;
  cmValue local_6e8;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  undefined1 local_6b0 [8];
  string message_4;
  string local_688;
  undefined1 local_668 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  testLauncher;
  string local_638;
  cmValue local_618;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  char local_5ba [2];
  undefined1 local_5b8 [8];
  string message_3;
  string local_590;
  cmValue local_570;
  cmValue tsName;
  string local_560;
  allocator<char> local_539;
  string local_538;
  char local_512 [2];
  undefined1 local_510 [8];
  string message_2;
  string local_4e8;
  cmValue local_4c8;
  cmValue platformName;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  char local_46a [2];
  undefined1 local_468 [8];
  string message_1;
  string local_440;
  cmValue local_420;
  cmValue instance;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string envToolchain;
  string local_3a0;
  cmValue local_380;
  allocator<char> local_371;
  string local_370;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  char local_292 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  string message;
  string local_248;
  cmValue local_228;
  cmValue genName;
  string local_218;
  undefined1 local_1f8 [16];
  string local_1e8;
  undefined1 local_1c8 [8];
  string fullName;
  string local_1a0;
  cmValue local_180;
  cmValue extraGenName;
  string local_170;
  cmValue local_150;
  cmValue genName_1;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined4 local_f4;
  string local_f0;
  Status local_d0;
  Status local_c8;
  undefined1 local_c0 [8];
  string redirectsDir;
  string local_98;
  allocator<char> local_71;
  string local_70;
  int local_50;
  Status SStack_4c;
  int res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmake *local_18;
  cmake *this_local;
  
  local_18 = this;
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::operator+(&local_38,psVar3,"/CMakeFiles/CMakeScratch");
  SStack_4c = cmsys::SystemTools::RemoveADirectory(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_50 = DoPreConfigureChecks(this);
  if (local_50 < 0) {
    return -2;
  }
  if (local_50 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_HOME_DIRECTORY",&local_71);
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "Source directory with the top level CMakeLists.txt file for this project",
               (allocator<char> *)(redirectsDir.field_2._M_local_buf + 0xf));
    AddCacheEntry(this,&local_70,psVar3,&local_98,4);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(redirectsDir.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[25]>
            ((string *)local_c0,psVar3,(char (*) [25])"/CMakeFiles/pkgRedirects");
  local_c8 = cmsys::SystemTools::RemoveADirectory((string *)local_c0);
  local_d0 = cmsys::SystemTools::MakeDirectory((string *)local_c0,(mode_t *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_d0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"Value Computed by CMake.",
               (allocator<char> *)((long)&genName_1.Value + 7));
    AddCacheEntry(this,&local_118,(string *)local_c0,&local_140,5);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&genName_1.Value + 7));
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
    if (!bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"CMAKE_GENERATOR",
                 (allocator<char> *)((long)&extraGenName.Value + 7));
      local_150 = cmState::GetInitializedCacheValue(pcVar4,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName.Value + 7));
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"CMAKE_EXTRA_GENERATOR",
                 (allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      local_180 = cmState::GetInitializedCacheValue(pcVar4,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      bVar1 = cmValue::operator_cast_to_bool(&local_150);
      if (bVar1) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_150);
        bVar1 = cmValue::operator_cast_to_bool(&local_180);
        local_1f8[0xe] = 0;
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_(&local_180);
          std::__cxx11::string::string((string *)&local_1e8,(string *)psVar5);
        }
        else {
          std::allocator<char>::allocator();
          local_1f8[0xe] = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e8,"",(allocator<char> *)(local_1f8 + 0xf));
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_1c8,psVar3,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        if ((local_1f8[0xe] & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(local_1f8 + 0xf));
        }
        CreateGlobalGenerator((cmake *)local_1f8,(string *)this,SUB81(local_1c8,0));
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator=
                  (&this->GlobalGenerator,
                   (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   local_1f8);
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                  ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   local_1f8);
        std::__cxx11::string::~string((string *)local_1c8);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
      if (bVar1) {
        pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        bVar1 = cmGlobalGenerator::GetForceUnixPaths(pcVar6);
        cmSystemTools::SetForceUnixPaths(bVar1);
      }
      else {
        CreateDefaultGlobalGenerator(this);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"Could not create generator",
                   (allocator<char> *)((long)&genName.Value + 7));
        cmSystemTools::Error(&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator((allocator<char> *)((long)&genName.Value + 7));
        this_local._4_4_ = -1;
        local_f4 = 1;
        goto LAB_005c5fe3;
      }
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"CMAKE_GENERATOR",
               (allocator<char> *)(message.field_2._M_local_buf + 0xf));
    local_228 = cmState::GetInitializedCacheValue(pcVar4,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_228);
    if (bVar1) {
      pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_228);
      uVar2 = (*pcVar6->_vptr_cmGlobalGenerator[4])(pcVar6,psVar3);
      if ((uVar2 & 1) == 0) {
        pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        (*pcVar6->_vptr_cmGlobalGenerator[3])(&local_290);
        local_292[1] = 10;
        psVar3 = cmValue::operator*[abi_cxx11_(&local_228);
        local_292[0] = '\n';
        cmStrCat<char_const(&)[20],std::__cxx11::string,char,char_const(&)[47],std::__cxx11::string_const&,char,char_const(&)[103]>
                  ((string *)local_270,(char (*) [20])"Error: generator : ",&local_290,local_292 + 1
                   ,(char (*) [47])"Does not match the generator used previously: ",psVar3,local_292
                   ,(char (*) [103])
                    "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        std::__cxx11::string::~string((string *)&local_290);
        cmSystemTools::Error((string *)local_270);
        this_local._4_4_ = -2;
        local_f4 = 1;
        std::__cxx11::string::~string((string *)local_270);
        goto LAB_005c5fe3;
      }
    }
    bVar1 = cmValue::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"CMAKE_GENERATOR",&local_2b9);
      pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      (*pcVar6->_vptr_cmGlobalGenerator[3])(&local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"Name of generator.",&local_301);
      AddCacheEntry(this,&local_2b8,&local_2e0,&local_300,4);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator(&local_2b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"CMAKE_EXTRA_GENERATOR",&local_329);
      pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_350,pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"Name of external makefile project generator.",&local_371);
      AddCacheEntry(this,&local_328,&local_350,&local_370,4);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"CMAKE_TOOLCHAIN_FILE",
                 (allocator<char> *)(envToolchain.field_2._M_local_buf + 0xf));
      local_380 = cmState::GetInitializedCacheValue(pcVar4,&local_3a0);
      bVar1 = cmValue::operator_cast_to_bool(&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)(envToolchain.field_2._M_local_buf + 0xf))
      ;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::string((string *)local_3c8);
        bVar1 = cmsys::SystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE",(string *)local_3c8);
        if ((bVar1) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"CMAKE_TOOLCHAIN_FILE",&local_3e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_410,"The CMake toolchain file",
                     (allocator<char> *)((long)&instance.Value + 7));
          AddCacheEntry(this,&local_3e8,(string *)local_3c8,&local_410,2);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator((allocator<char> *)((long)&instance.Value + 7));
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
        }
        std::__cxx11::string::~string((string *)local_3c8);
      }
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"CMAKE_GENERATOR_INSTANCE",
               (allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    local_420 = cmState::GetInitializedCacheValue(pcVar4,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_420);
    if (bVar1) {
      if ((this->GeneratorInstanceSet & 1U) != 0) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_420);
        bVar1 = std::operator!=(&this->GeneratorInstance,psVar3);
        if (bVar1) {
          local_46a[1] = 10;
          psVar3 = cmValue::operator*[abi_cxx11_(&local_420);
          local_46a[0] = '\n';
          cmStrCat<char_const(&)[28],std::__cxx11::string&,char,char_const(&)[46],std::__cxx11::string_const&,char,char_const(&)[103]>
                    ((string *)local_468,(char (*) [28])"Error: generator instance: ",
                     &this->GeneratorInstance,local_46a + 1,
                     (char (*) [46])"Does not match the instance used previously: ",psVar3,local_46a
                     ,(char (*) [103])
                      "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_468);
          this_local._4_4_ = -2;
          local_f4 = 1;
          std::__cxx11::string::~string((string *)local_468);
          goto LAB_005c5fe3;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"CMAKE_GENERATOR_INSTANCE",&local_491);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,"Generator instance identifier.",
                 (allocator<char> *)((long)&platformName.Value + 7));
      AddCacheEntry(this,&local_490,&this->GeneratorInstance,&local_4b8,4);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&platformName.Value + 7));
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator(&local_491);
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,"CMAKE_GENERATOR_PLATFORM",
               (allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
    local_4c8 = cmState::GetInitializedCacheValue(pcVar4,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_4c8);
    if (bVar1) {
      if ((this->GeneratorPlatformSet & 1U) != 0) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_4c8);
        bVar1 = std::operator!=(&this->GeneratorPlatform,psVar3);
        if (bVar1) {
          local_512[1] = 10;
          psVar3 = cmValue::operator*[abi_cxx11_(&local_4c8);
          local_512[0] = '\n';
          cmStrCat<char_const(&)[28],std::__cxx11::string&,char,char_const(&)[46],std::__cxx11::string_const&,char,char_const(&)[103]>
                    ((string *)local_510,(char (*) [28])"Error: generator platform: ",
                     &this->GeneratorPlatform,local_512 + 1,
                     (char (*) [46])"Does not match the platform used previously: ",psVar3,local_512
                     ,(char (*) [103])
                      "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_510);
          this_local._4_4_ = -2;
          local_f4 = 1;
          std::__cxx11::string::~string((string *)local_510);
          goto LAB_005c5fe3;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"CMAKE_GENERATOR_PLATFORM",&local_539);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,"Name of generator platform.",
                 (allocator<char> *)((long)&tsName.Value + 7));
      AddCacheEntry(this,&local_538,&this->GeneratorPlatform,&local_560,4);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tsName.Value + 7));
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"CMAKE_GENERATOR_TOOLSET",
               (allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
    local_570 = cmState::GetInitializedCacheValue(pcVar4,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_570);
    if (bVar1) {
      if ((this->GeneratorToolsetSet & 1U) != 0) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_570);
        bVar1 = std::operator!=(&this->GeneratorToolset,psVar3);
        if (bVar1) {
          local_5ba[1] = 10;
          psVar3 = cmValue::operator*[abi_cxx11_(&local_570);
          local_5ba[0] = '\n';
          cmStrCat<char_const(&)[27],std::__cxx11::string&,char,char_const(&)[45],std::__cxx11::string_const&,char,char_const(&)[103]>
                    ((string *)local_5b8,(char (*) [27])"Error: generator toolset: ",
                     &this->GeneratorToolset,local_5ba + 1,
                     (char (*) [45])"Does not match the toolset used previously: ",psVar3,local_5ba,
                     (char (*) [103])
                     "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_5b8);
          this_local._4_4_ = -2;
          local_f4 = 1;
          std::__cxx11::string::~string((string *)local_5b8);
          goto LAB_005c5fe3;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"CMAKE_GENERATOR_TOOLSET",&local_5e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,"Name of generator toolset.",&local_609);
      AddCacheEntry(this,&local_5e0,&this->GeneratorToolset,&local_608,4);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator(&local_609);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator(&local_5e1);
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_638,"CMAKE_TEST_LAUNCHER",
               (allocator<char> *)
               &testLauncher.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0x27);
    local_618 = cmState::GetInitializedCacheValue(pcVar4,&local_638);
    bVar1 = cmValue::operator_cast_to_bool(&local_618);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &testLauncher.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0x27);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_688,"CMAKE_TEST_LAUNCHER",
                 (allocator<char> *)(message_4.field_2._M_local_buf + 0xf));
      cmSystemTools::GetEnvVar
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,&local_688);
      std::__cxx11::string::~string((string *)&local_688);
      std::allocator<char>::~allocator((allocator<char> *)(message_4.field_2._M_local_buf + 0xf));
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_668);
      if (bVar1) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_668);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_6b0,"Test launcher to run tests executable.",&local_6b1);
          std::allocator<char>::~allocator(&local_6b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d8,"CMAKE_TEST_LAUNCHER",&local_6d9);
          pbVar8 = std::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_668);
          AddCacheEntry(this,&local_6d8,pbVar8,(string *)local_6b0,3);
          std::__cxx11::string::~string((string *)&local_6d8);
          std::allocator<char>::~allocator(&local_6d9);
          std::__cxx11::string::~string((string *)local_6b0);
        }
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_668);
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"CMAKE_CROSSCOMPILING_EMULATOR",
               (allocator<char> *)
               &emulator.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0x27);
    local_6e8 = cmState::GetInitializedCacheValue(pcVar4,&local_708);
    bVar1 = cmValue::operator_cast_to_bool(&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &emulator.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0x27);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"CMAKE_CROSSCOMPILING_EMULATOR",
                 (allocator<char> *)(message_5.field_2._M_local_buf + 0xf));
      cmSystemTools::GetEnvVar
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_738,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::allocator<char>::~allocator((allocator<char> *)(message_5.field_2._M_local_buf + 0xf));
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_738);
      if (bVar1) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_738);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_780,
                     "Emulator to run executables and tests when cross compiling.",&local_781);
          std::allocator<char>::~allocator(&local_781);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7a8,"CMAKE_CROSSCOMPILING_EMULATOR",&local_7a9);
          pbVar8 = std::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_738);
          AddCacheEntry(this,&local_7a8,pbVar8,(string *)local_780,3);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::allocator<char>::~allocator(&local_7a9);
          std::__cxx11::string::~string((string *)local_780);
        }
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_738);
    }
    bVar1 = GetIsInTryCompile(this);
    if (!bVar1) {
      pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      cmGlobalGenerator::ClearEnabledLanguages(pcVar6);
    }
    local_7c8._8_8_ = this;
    std::make_unique<cmFileAPI,cmake*>((cmake **)(local_7c8 + 0x10));
    std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator=
              (&this->FileAPI,
               (unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> *)(local_7c8 + 0x10));
    std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr
              ((unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> *)(local_7c8 + 0x10));
    pcVar9 = std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator->(&this->FileAPI)
    ;
    cmFileAPI::ReadQueries(pcVar9);
    bVar1 = GetIsInTryCompile(this);
    if (!bVar1) {
      TruncateOutputLog(this,"CMakeConfigureLog.yaml");
      psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
      local_7f8 = (string_view)::cm::operator____s("/CMakeFiles",0xb);
      cmStrCat<std::__cxx11::string_const&,cm::static_string_view>
                (&local_7e8,psVar3,(static_string_view *)&local_7f8);
      pcVar9 = std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator->
                         (&this->FileAPI);
      cmFileAPI::GetConfigureLogVersions(&local_810,pcVar9);
      std::
      make_unique<cmConfigureLog,std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_7e8);
      std::unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::operator=
                (&this->ConfigureLog,
                 (unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)local_7c8);
      std::unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::~unique_ptr
                ((unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_> *)local_7c8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_810);
      std::__cxx11::string::~string((string *)&local_7e8);
    }
    pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                       (&this->GlobalGenerator);
    (*pcVar6->_vptr_cmGlobalGenerator[0xc])();
    std::unique_ptr<cmConfigureLog,_std::default_delete<cmConfigureLog>_>::reset
              (&this->ConfigureLog,(pointer)0x0);
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_838,"CMAKE_BACKWARDS_COMPATIBILITY",&local_839);
    local_818 = cmState::GetInitializedCacheValue(pcVar4,&local_838);
    bVar1 = cmValue::operator_cast_to_bool(&local_818);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator(&local_839);
    if (bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_868,"LIBRARY_OUTPUT_PATH",&local_869);
      local_848 = cmState::GetInitializedCacheValue(pcVar4,&local_868);
      bVar1 = cmValue::operator_cast_to_bool(&local_848);
      std::__cxx11::string::~string((string *)&local_868);
      std::allocator<char>::~allocator(&local_869);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_890,"LIBRARY_OUTPUT_PATH",&local_891);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"",&local_8b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e0,"Single output directory for building all libraries.",
                   &local_8e1);
        AddCacheEntry(this,&local_890,&local_8b8,&local_8e0,1);
        std::__cxx11::string::~string((string *)&local_8e0);
        std::allocator<char>::~allocator(&local_8e1);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::allocator<char>::~allocator(&local_8b9);
        std::__cxx11::string::~string((string *)&local_890);
        std::allocator<char>::~allocator(&local_891);
      }
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"EXECUTABLE_OUTPUT_PATH",&local_911);
      local_8f0 = cmState::GetInitializedCacheValue(pcVar4,&local_910);
      bVar1 = cmValue::operator_cast_to_bool(&local_8f0);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_938,"EXECUTABLE_OUTPUT_PATH",&local_939);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"",&local_961);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_988,"Single output directory for building all executables.",
                   (allocator<char> *)((long)&mf + 7));
        AddCacheEntry(this,&local_938,&local_960,&local_988,1);
        std::__cxx11::string::~string((string *)&local_988);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
        std::__cxx11::string::~string((string *)&local_960);
        std::allocator<char>::~allocator(&local_961);
        std::__cxx11::string::~string((string *)&local_938);
        std::allocator<char>::~allocator(&local_939);
      }
    }
    pcVar6 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                       (&this->GlobalGenerator);
    this_00 = cmGlobalGenerator::GetMakefiles(pcVar6);
    local_998 = std::
                vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ::operator[](this_00,0);
    this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(local_998);
    std::allocator<char>::allocator();
    local_9ea = 0;
    local_9eb = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,"CTEST_USE_LAUNCHERS",&local_9b9);
    bVar1 = cmMakefile::IsOn(this_01,&local_9b8);
    local_d5a = 0;
    if (bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      local_9ea = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9e8,"RULE_LAUNCH_COMPILE",&local_9e9);
      local_9eb = 1;
      local_9c8 = cmState::GetGlobalProperty(pcVar4,&local_9e8);
      bVar1 = cmValue::operator_cast_to_bool(&local_9c8);
      local_d5a = bVar1 ^ 0xff;
    }
    if ((local_9eb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_9e8);
    }
    if ((local_9ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_9e9);
    }
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    if ((local_d5a & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,
                 "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                 ,&local_a11);
      cmSystemTools::Error(&local_a10);
      std::__cxx11::string::~string((string *)&local_a10);
      std::allocator<char>::~allocator(&local_a11);
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    messenger = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::get
                          (&this->Messenger);
    cmState::SaveVerificationScript(pcVar4,psVar3,messenger);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    SaveCache(this,psVar3);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this_local._4_4_ = -1;
      local_f4 = 1;
    }
    else {
      this_local._4_4_ = 0;
      local_f4 = 1;
    }
  }
  else {
    cmStrCat<char_const(&)[60],std::__cxx11::string_const&,char_const(&)[254]>
              (&local_f0,
               (char (*) [60])"Unable to (re)create the private pkgRedirects directory:\n  ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [254])
               "\nThis may be caused by not having read/write access to the build directory.\nTry specifying a location with read/write access like:\n  cmake -B build\nIf using a CMake presets file, ensure that preset parameter\n\'binaryDir\' expands to a writable directory.\n"
              );
    cmSystemTools::Error(&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_local._4_4_ = -1;
    local_f4 = 1;
  }
LAB_005c5fe3:
  std::__cxx11::string::~string((string *)local_c0);
  return this_local._4_4_;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  cmSystemTools::RemoveADirectory(this->GetHomeOutputDirectory() +
                                  "/CMakeFiles/CMakeScratch");

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // We want to create the package redirects directory as early as possible,
  // but not before pre-configure checks have passed. This ensures we get
  // errors about inappropriate source/binary directories first.
  const auto redirectsDir =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles/pkgRedirects");
  cmSystemTools::RemoveADirectory(redirectsDir);
  if (!cmSystemTools::MakeDirectory(redirectsDir)) {
    cmSystemTools::Error(
      cmStrCat("Unable to (re)create the private pkgRedirects directory:\n  ",
               redirectsDir,
               "\n"
               "This may be caused by not having read/write access to "
               "the build directory.\n"
               "Try specifying a location with read/write access like:\n"
               "  cmake -B build\n"
               "If using a CMake presets file, ensure that preset parameter\n"
               "'binaryDir' expands to a writable directory.\n"));
    return -1;
  }
  this->AddCacheEntry("CMAKE_FIND_PACKAGE_REDIRECTS_DIR", redirectsDir,
                      "Value Computed by CMake.", cmStateEnums::STATIC);

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    cmValue extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = cmStrCat(
        "Error: generator : ", this->GlobalGenerator->GetName(), '\n',
        "Does not match the generator used previously: ", *genName, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!genName) {
    this->AddCacheEntry("CMAKE_GENERATOR", this->GlobalGenerator->GetName(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry(
      "CMAKE_EXTRA_GENERATOR", this->GlobalGenerator->GetExtraGeneratorName(),
      "Name of external makefile project generator.", cmStateEnums::INTERNAL);

    if (!this->State->GetInitializedCacheValue("CMAKE_TOOLCHAIN_FILE")) {
      std::string envToolchain;
      if (cmSystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE", envToolchain) &&
          !envToolchain.empty()) {
        this->AddCacheEntry("CMAKE_TOOLCHAIN_FILE", envToolchain,
                            "The CMake toolchain file",
                            cmStateEnums::FILEPATH);
      }
    }
  }

  if (cmValue instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message = cmStrCat(
        "Error: generator instance: ", this->GeneratorInstance, '\n',
        "Does not match the instance used previously: ", *instance, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance,
                        "Generator instance identifier.",
                        cmStateEnums::INTERNAL);
  }

  if (cmValue platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = cmStrCat(
        "Error: generator platform: ", this->GeneratorPlatform, '\n',
        "Does not match the platform used previously: ", *platformName, '\n',
        "Either remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform,
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (cmValue tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message =
        cmStrCat("Error: generator toolset: ", this->GeneratorToolset, '\n',
                 "Does not match the toolset used previously: ", *tsName, '\n',
                 "Either remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset,
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  if (!this->State->GetInitializedCacheValue("CMAKE_TEST_LAUNCHER")) {
    cm::optional<std::string> testLauncher =
      cmSystemTools::GetEnvVar("CMAKE_TEST_LAUNCHER");
    if (testLauncher && !testLauncher->empty()) {
      std::string message = "Test launcher to run tests executable.";
      this->AddCacheEntry("CMAKE_TEST_LAUNCHER", *testLauncher, message,
                          cmStateEnums::STRING);
    }
  }

  if (!this->State->GetInitializedCacheValue(
        "CMAKE_CROSSCOMPILING_EMULATOR")) {
    cm::optional<std::string> emulator =
      cmSystemTools::GetEnvVar("CMAKE_CROSSCOMPILING_EMULATOR");
    if (emulator && !emulator->empty()) {
      std::string message =
        "Emulator to run executables and tests when cross compiling.";
      this->AddCacheEntry("CMAKE_CROSSCOMPILING_EMULATOR", *emulator, message,
                          cmStateEnums::STRING);
    }
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();
  }

#if !defined(CMAKE_BOOTSTRAP)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();

  if (!this->GetIsInTryCompile()) {
    this->TruncateOutputLog("CMakeConfigureLog.yaml");
    this->ConfigureLog = cm::make_unique<cmConfigureLog>(
      cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles"_s),
      this->FileAPI->GetConfigureLogVersions());
  }
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();

#if !defined(CMAKE_BOOTSTRAP)
  this->ConfigureLog.reset();
#endif

  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  const auto& mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory(),
                                      this->Messenger.get());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  return 0;
}